

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlDocPtr xmlSAXParseDoc(xmlSAXHandlerPtr sax,xmlChar *cur,int recovery)

{
  xmlParserCtxtPtr ctxt_00;
  _xmlSAXHandler *local_40;
  xmlSAXHandlerPtr oldsax;
  xmlParserCtxtPtr ctxt;
  xmlDocPtr ret;
  int recovery_local;
  xmlChar *cur_local;
  xmlSAXHandlerPtr sax_local;
  
  local_40 = (_xmlSAXHandler *)0x0;
  if (cur == (xmlChar *)0x0) {
    sax_local = (xmlSAXHandlerPtr)0x0;
  }
  else {
    ctxt_00 = xmlCreateDocParserCtxt(cur);
    if (ctxt_00 == (xmlParserCtxtPtr)0x0) {
      sax_local = (xmlSAXHandlerPtr)0x0;
    }
    else {
      if (sax != (xmlSAXHandlerPtr)0x0) {
        local_40 = ctxt_00->sax;
        ctxt_00->sax = sax;
        ctxt_00->userData = (void *)0x0;
      }
      xmlParseDocument(ctxt_00);
      if ((ctxt_00->wellFormed == 0) && (recovery == 0)) {
        ctxt = (xmlParserCtxtPtr)0x0;
        xmlFreeDoc(ctxt_00->myDoc);
        ctxt_00->myDoc = (xmlDocPtr)0x0;
      }
      else {
        ctxt = (xmlParserCtxtPtr)ctxt_00->myDoc;
      }
      if (sax != (xmlSAXHandlerPtr)0x0) {
        ctxt_00->sax = local_40;
      }
      xmlFreeParserCtxt(ctxt_00);
      sax_local = (xmlSAXHandlerPtr)ctxt;
    }
  }
  return (xmlDocPtr)sax_local;
}

Assistant:

xmlDocPtr
xmlSAXParseDoc(xmlSAXHandlerPtr sax, const xmlChar *cur, int recovery) {
    xmlDocPtr ret;
    xmlParserCtxtPtr ctxt;
    xmlSAXHandlerPtr oldsax = NULL;

    if (cur == NULL) return(NULL);


    ctxt = xmlCreateDocParserCtxt(cur);
    if (ctxt == NULL) return(NULL);
    if (sax != NULL) {
        oldsax = ctxt->sax;
        ctxt->sax = sax;
        ctxt->userData = NULL;
    }

    xmlParseDocument(ctxt);
    if ((ctxt->wellFormed) || recovery) ret = ctxt->myDoc;
    else {
       ret = NULL;
       xmlFreeDoc(ctxt->myDoc);
       ctxt->myDoc = NULL;
    }
    if (sax != NULL)
	ctxt->sax = oldsax;
    xmlFreeParserCtxt(ctxt);

    return(ret);
}